

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O1

int __thiscall
Layer_c_api::forward_inplace
          (Layer_c_api *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_> bottom_top_blobs0;
  allocator_type local_41;
  vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_> local_40;
  
  uVar4 = (int)((long)(bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3) * 0x38e38e39;
  std::vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>::vector
            (&local_40,(long)(int)uVar4,&local_41);
  if (0 < (int)uVar4) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      local_40.super__Vector_base<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] =
           (ncnn_mat_t)
           ((long)&((bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start)->data + lVar2);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x48;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  iVar1 = (*this->layer->forward_inplace_n)
                    (this->layer,
                     local_40.super__Vector_base<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,uVar4,(ncnn_option_t)opt);
  if (local_40.super__Vector_base<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>._M_impl.
      super__Vector_impl_data._M_start != (ncnn_mat_t *)0x0) {
    operator_delete(local_40.super__Vector_base<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar1;
}

Assistant:

virtual int forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
    {
        const int n = bottom_top_blobs.size();
        std::vector<ncnn_mat_t> bottom_top_blobs0(n);
        for (int i = 0; i < n; i++)
        {
            bottom_top_blobs0[i] = (ncnn_mat_t)&bottom_top_blobs[i];
        }
        return layer->forward_inplace_n(layer, bottom_top_blobs0.data(), n, (ncnn_option_t)&opt);
    }